

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

CompressionRecord * Imf_3_3::anon_unknown_1::retrieveCompressionRecord(Header *hdr)

{
  int iVar1;
  CompressionStash *pCVar2;
  CompressionRecord *pCVar3;
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  *unaff_retaddr;
  lock_guard<std::mutex> lk;
  CompressionStash *s;
  mutex_type *in_stack_ffffffffffffffb8;
  CompressionRecord *in_stack_ffffffffffffffc0;
  key_type *in_stack_fffffffffffffff8;
  
  pCVar2 = getStash();
  if (pCVar2 == (CompressionStash *)0x0) {
    if ((anonymous_namespace)::retrieveCompressionRecord(Imf_3_3::Header*)::defrec == '\0') {
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   retrieveCompressionRecord(Imf_3_3::Header*)::defrec);
      if (iVar1 != 0) {
        CompressionRecord::CompressionRecord(in_stack_ffffffffffffffc0);
        __cxa_guard_release(&(anonymous_namespace)::retrieveCompressionRecord(Imf_3_3::Header*)::
                             defrec);
      }
    }
    pCVar3 = &retrieveCompressionRecord::defrec;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pCVar3 = std::
             map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
             ::operator[](unaff_retaddr,in_stack_fffffffffffffff8);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x965f42);
  }
  return pCVar3;
}

Assistant:

static CompressionRecord&
retrieveCompressionRecord (Header* hdr)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        return s->_store[hdr];
    }
    // this will only happen at app shutdown, so it'd be an invalid
    // store anyway, but just return something to avoid a crash
    static CompressionRecord defrec;
    return defrec;
}